

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *this;
  Value *pVVar1;
  Value *key;
  Value *this_00;
  Value *in_stack_fffffffffffffe38;
  undefined1 value;
  Value *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  Value *in_stack_fffffffffffffe50;
  Value *in_stack_fffffffffffffe70;
  
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe70);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  this = Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  pVVar1 = Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,(Int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  key = Value::operator[](pVVar1,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  this_00 = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this_00,in_stack_fffffffffffffe38);
  value = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
  Value::~Value(this);
  Value::Value(this_00,(bool)value);
  pVVar1 = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this_00,pVVar1);
  Value::~Value(this);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
//! [CharReaderBuilderDefaults]
}